

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smf.c
# Opt level: O0

smf_event_t * smf_get_next_event(smf_t *smf)

{
  smf_track_t *track_00;
  smf_track_t *track;
  smf_event_t *event;
  smf_t *smf_local;
  
  track_00 = smf_find_track_with_next_event(smf);
  if (track_00 == (smf_track_t *)0x0) {
    smf_local = (smf_t *)0x0;
  }
  else {
    smf_local = (smf_t *)smf_track_get_next_event(track_00);
    if (smf_local == (smf_t *)0x0) {
      __assert_fail("event != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/davidhsilaban[P]munt/mt32emu_smf2wav/libsmf/src/smf.c"
                    ,0x34d,"smf_event_t *smf_get_next_event(smf_t *)");
    }
    *(undefined8 *)(**(long **)smf_local + 0x40) = 0xbff0000000000000;
  }
  return (smf_event_t *)smf_local;
}

Assistant:

smf_event_t *
smf_get_next_event(smf_t *smf)
{
	smf_event_t *event;
	smf_track_t *track = smf_find_track_with_next_event(smf);

	if (track == NULL) {
#if 0
		g_debug("End of the song.");
#endif

		return (NULL);
	}

	event = smf_track_get_next_event(track);
	
	assert(event != NULL);

	event->track->smf->last_seek_position = -1.0;

	return (event);
}